

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::texture::util::TextureBinding::updateTextureData
          (TextureBinding *this,TestTextureSp *textureData,Type textureType)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  deUint32 queueFamilyIndex_00;
  VkQueue pVVar2;
  VkQueue device;
  VkDevice pVVar3;
  undefined4 uVar4;
  VkImageViewType type;
  VkImageType VVar5;
  uint uVar6;
  CompressedTexFormat format_00;
  int iVar7;
  VkResult VVar8;
  MovePtr *allocator_00;
  TestTexture *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstanceInterface *pIVar10;
  VkPhysicalDevice pVVar11;
  NotSupportedError *pNVar12;
  char *pcVar13;
  Handle<(vk::HandleType)9> *pHVar14;
  Allocation *pAVar15;
  VkDeviceMemory VVar16;
  VkDeviceSize VVar17;
  MovePtr *this_00;
  undefined4 uVar18;
  VkFormat local_1fc;
  VkMemoryRequirements local_1c8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1b0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1a0;
  Move<vk::Handle<(vk::HandleType)9>_> local_190;
  RefData<vk::Handle<(vk::HandleType)9>_> local_170;
  undefined1 local_150 [8];
  VkImageCreateInfo imageParams;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  VkResult local_9c;
  uint local_98;
  VkResult imageFormatQueryResult;
  VkImageFormatProperties imageFormatProperties;
  deUint32 arraySize;
  deUint32 mipLevels;
  UVec3 textureDimension;
  VkFormat format;
  VkImageUsageFlags imageUsageFlags;
  VkImageTiling imageTiling;
  VkImageType imageType;
  VkImageViewType imageViewType;
  VkImageCreateFlags imageCreateFlags;
  bool isCube;
  Allocator *allocator;
  VkQueue pVStack_38;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vkd;
  TestTextureSp *pTStack_18;
  Type textureType_local;
  TestTextureSp *textureData_local;
  TextureBinding *this_local;
  
  vkd._4_4_ = textureType;
  pTStack_18 = textureData;
  textureData_local = (TestTextureSp *)this;
  vkDevice = (VkDevice)Context::getDeviceInterface(this->m_context);
  queue = (VkQueue)Context::getDevice(this->m_context);
  pVStack_38 = Context::getUniversalQueue(this->m_context);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex(this->m_context);
  allocator_00 = (MovePtr *)Context::getDefaultAllocator(this->m_context);
  this->m_type = vkd._4_4_;
  de::SharedPtr<vkt::pipeline::TestTexture>::operator=(&this->m_textureData,pTStack_18);
  uVar4 = 0;
  if (this->m_type == TYPE_CUBE_MAP) {
    uVar4 = 0x10;
  }
  type = textureTypeToImageViewType(vkd._4_4_);
  VVar5 = imageViewTypeToImageType(type);
  textureDimension.m_data[2] = 6;
  pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
  uVar6 = (*pTVar9->_vptr_TestTexture[5])();
  if ((uVar6 & 1) == 0) {
    pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
    iVar7 = (*pTVar9->_vptr_TestTexture[0xe])();
    local_1fc = ::vk::mapTextureFormat((TextureFormat *)CONCAT44(extraout_var_00,iVar7));
  }
  else {
    pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
    iVar7 = (*pTVar9->_vptr_TestTexture[9])(pTVar9,0);
    format_00 = tcu::CompressedTexture::getFormat((CompressedTexture *)CONCAT44(extraout_var,iVar7))
    ;
    local_1fc = ::vk::mapCompressedTextureFormat(format_00);
  }
  textureDimension.m_data[1] = local_1fc;
  pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
  (*pTVar9->_vptr_TestTexture[0xf])(&arraySize);
  pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
  imageFormatProperties.maxResourceSize._4_4_ = (*pTVar9->_vptr_TestTexture[2])();
  pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator->(pTStack_18);
  imageFormatProperties.maxResourceSize._0_4_ = (*pTVar9->_vptr_TestTexture[4])();
  pIVar10 = Context::getInstanceInterface(this->m_context);
  pVVar11 = Context::getPhysicalDevice(this->m_context);
  local_9c = (*pIVar10->_vptr_InstanceInterface[4])
                       (pIVar10,pVVar11,(ulong)textureDimension.m_data[1],(ulong)VVar5,0,6,uVar4,
                        &local_98);
  if (local_9c == VK_ERROR_FORMAT_NOT_SUPPORTED) {
    imageParams.initialLayout._3_1_ = 1;
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Format not supported: ",&local_e1);
    pcVar13 = ::vk::getFormatName(textureDimension.m_data[1]);
    std::operator+(&local_c0,&local_e0,pcVar13);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    tcu::NotSupportedError::NotSupportedError
              (pNVar12,pcVar13,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x146);
    imageParams.initialLayout._3_1_ = VK_IMAGE_LAYOUT_UNDEFINED >> 0x18;
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  ::vk::checkResult(local_9c,"imageFormatQueryResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x149);
  if (imageFormatProperties.maxExtent.depth < (uint)imageFormatProperties.maxResourceSize) {
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar12,"Maximum array layers number for this format is not enough for this test.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x14c);
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (imageFormatProperties.maxExtent.height < imageFormatProperties.maxResourceSize._4_4_) {
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar12,"Maximum mimap level number for this format is not enough for this test.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x14f);
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  uVar6 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&arraySize);
  if (uVar6 <= local_98) {
    VVar8 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&arraySize);
    if ((uint)VVar8 <= (uint)imageFormatQueryResult) {
      uVar6 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&arraySize);
      if (uVar6 <= imageFormatProperties.maxExtent.width) {
        local_150._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        imageParams._4_4_ = 0;
        imageParams.flags = textureDimension.m_data[1];
        imageParams.pNext._0_4_ = uVar4;
        imageParams.pNext._4_4_ = VVar5;
        imageParams.imageType =
             tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&arraySize);
        imageParams.format = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&arraySize);
        imageParams.extent.width =
             tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&arraySize);
        imageParams.extent.height = imageFormatProperties.maxResourceSize._4_4_;
        imageParams.extent.depth = (uint)imageFormatProperties.maxResourceSize;
        imageParams.mipLevels = 1;
        imageParams.arrayLayers = 0;
        imageParams.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT;
        imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageParams.usage = 1;
        imageParams._64_8_ = (long)&allocator + 4;
        imageParams.pQueueFamilyIndices._0_4_ = 0;
        ::vk::createImage(&local_190,(DeviceInterface *)vkDevice,(VkDevice)queue,
                          (VkImageCreateInfo *)local_150,(VkAllocationCallbacks *)0x0);
        ::vk::refdetails::Move::operator_cast_to_RefData(&local_170,(Move *)&local_190);
        uVar4 = (undefined4)local_170.object.m_internal;
        uVar18 = (undefined4)(local_170.object.m_internal >> 0x20);
        data_00.deleter.m_deviceIface = local_170.deleter.m_deviceIface;
        data_00.object.m_internal = local_170.object.m_internal;
        data_00.deleter.m_device = local_170.deleter.m_device;
        data_00.deleter.m_allocator = local_170.deleter.m_allocator;
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
                  (&this->m_textureImage,data_00);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_190);
        pVVar3 = vkDevice;
        pVVar2 = queue;
        pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        ::vk::getImageMemoryRequirements
                  (&local_1c8,(DeviceInterface *)pVVar3,(VkDevice)pVVar2,
                   (VkImage)pHVar14->m_internal);
        this_00 = allocator_00;
        (*(*(_func_int ***)allocator_00)[3])
                  (&local_1b0,allocator_00,&local_1c8,(ulong)::vk::MemoryRequirement::Any);
        local_1a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1b0,this_00);
        data.ptr._4_4_ = uVar18;
        data.ptr._0_4_ = uVar4;
        data._8_8_ = local_170.deleter.m_deviceIface;
        de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
                  (&this->m_textureImageMemory,data);
        de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
                  ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1b0);
        pVVar3 = vkDevice;
        pVVar2 = queue;
        pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        dVar1 = pHVar14->m_internal;
        pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                  operator->(&(this->m_textureImageMemory).
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)
        ;
        VVar16 = ::vk::Allocation::getMemory(pAVar15);
        pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                  operator->(&(this->m_textureImageMemory).
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)
        ;
        VVar17 = ::vk::Allocation::getOffset(pAVar15);
        VVar8 = (**(code **)(*(long *)pVVar3 + 0x68))(pVVar3,pVVar2,dVar1,VVar16.m_internal,VVar17);
        ::vk::checkResult(VVar8,
                          "vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                          ,0x172);
        updateTextureViewMipLevels(this,0,imageFormatProperties.maxResourceSize._4_4_ - 1);
        pVVar3 = vkDevice;
        device = queue;
        pVVar2 = pVStack_38;
        queueFamilyIndex_00 = allocator._4_4_;
        pTVar9 = de::SharedPtr<vkt::pipeline::TestTexture>::operator*(&this->m_textureData);
        pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        vkt::pipeline::uploadTestTexture
                  ((DeviceInterface *)pVVar3,(VkDevice)device,pVVar2,queueFamilyIndex_00,
                   (Allocator *)allocator_00,pTVar9,(VkImage)pHVar14->m_internal);
        return;
      }
    }
  }
  pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar12,"Maximum image dimension for this format is not enough for this test.",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
             ,0x155);
  __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureBinding::updateTextureData (const TestTextureSp& textureData, const TextureBinding::Type textureType)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	m_type			= textureType;
	m_textureData	= textureData;

	const bool									isCube					= m_type == TYPE_CUBE_MAP;
	const VkImageCreateFlags					imageCreateFlags		= isCube ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0;
	const VkImageViewType						imageViewType			= textureTypeToImageViewType(textureType);
	const VkImageType							imageType				= imageViewTypeToImageType(imageViewType);
	const VkImageTiling							imageTiling				= VK_IMAGE_TILING_OPTIMAL;
	const VkImageUsageFlags						imageUsageFlags			= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	const VkFormat								format					= textureData->isCompressed() ? mapCompressedTextureFormat(textureData->getCompressedLevel(0, 0).getFormat()) : mapTextureFormat(textureData->getTextureFormat());
	const tcu::UVec3							textureDimension		= textureData->getTextureDimension();
	const deUint32								mipLevels				= textureData->getNumLevels();
	const deUint32								arraySize				= textureData->getArraySize();
	vk::VkImageFormatProperties					imageFormatProperties;
	const VkResult								imageFormatQueryResult	= m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(), format, imageType, imageTiling, imageUsageFlags, imageCreateFlags, &imageFormatProperties);

	if (imageFormatQueryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
	{
		TCU_THROW(NotSupportedError, (std::string("Format not supported: ") + vk::getFormatName(format)).c_str());
	}
	else
		VK_CHECK(imageFormatQueryResult);

	if (imageFormatProperties.maxArrayLayers < arraySize)
		TCU_THROW(NotSupportedError, ("Maximum array layers number for this format is not enough for this test."));

	if (imageFormatProperties.maxMipLevels < mipLevels)
		TCU_THROW(NotSupportedError, ("Maximum mimap level number for this format is not enough for this test."));

	if (imageFormatProperties.maxExtent.width < textureDimension.x() ||
		imageFormatProperties.maxExtent.height < textureDimension.y() ||
		imageFormatProperties.maxExtent.depth < textureDimension.z())
	{
		TCU_THROW(NotSupportedError, ("Maximum image dimension for this format is not enough for this test."));
	}

	// Create image
	const VkImageCreateInfo						imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			(deUint32)textureDimension.x(),
			(deUint32)textureDimension.y(),
			(deUint32)textureDimension.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arraySize,														// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,											// VkSampleCountFlagBits	samples;
		imageTiling,													// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	m_textureImage			= createImage(vkd, vkDevice, &imageParams);
	m_textureImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_textureImage), MemoryRequirement::Any);
	VK_CHECK(vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset()));

	updateTextureViewMipLevels(0, mipLevels - 1);

	pipeline::uploadTestTexture(vkd, vkDevice, queue, queueFamilyIndex, allocator, *m_textureData, *m_textureImage);
}